

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialogs.cpp
# Opt level: O1

void show_plugin_properties_dlg
               (void *hMainWnd,string *config_path,tExtensionStartupInfo *pExtension)

{
  tDialogBoxLFMProc p_Var1;
  char *pcVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  size_t sVar4;
  string error;
  stringstream body;
  ifstream ifs;
  Json local_3f8;
  string local_3e8;
  string local_3c8;
  stringstream local_3a8 [16];
  ostream local_398 [112];
  ios_base local_328 [264];
  long local_220 [2];
  streambuf local_210 [16];
  byte abStack_200 [488];
  
  gExtension = pExtension;
  std::__cxx11::string::_M_assign((string *)&gConfig_path_abi_cxx11_);
  std::ifstream::ifstream((string *)local_220);
  std::ifstream::open((string *)local_220,(_Ios_Openmode)config_path);
  if ((abStack_200[*(long *)(local_220[0] + -0x18)] & 5) == 0) {
    std::__cxx11::stringstream::stringstream(local_3a8);
    std::ostream::operator<<(local_398,local_210);
    std::ifstream::close();
    local_3c8._M_string_length = 0;
    local_3c8.field_2._M_local_buf[0] = '\0';
    local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
    std::__cxx11::stringbuf::str();
    json11::Json::parse(&local_3f8,&local_3e8,&local_3c8,STANDARD);
    _Var3._M_pi = local_3f8.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    gJson.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_3f8.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this = gJson.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ;
    local_3f8.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_3f8.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    gJson.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = _Var3._M_pi;
    if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
    }
    if (local_3f8.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_3f8.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,
                      CONCAT71(local_3c8.field_2._M_allocated_capacity._1_7_,
                               local_3c8.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_3a8);
    std::ios_base::~ios_base(local_328);
  }
  pcVar2 = config_dialog;
  p_Var1 = gExtension->DialogBoxLFM;
  sVar4 = strlen(config_dialog);
  (*p_Var1)((intptr_t)pcVar2,sVar4,DlgProc);
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

void show_plugin_properties_dlg(void *hMainWnd, std::string config_path, tExtensionStartupInfo *pExtension)
{
    gExtension = pExtension;
    gConfig_path = config_path;

    std::ifstream ifs;
    ifs.open(config_path, std::ios::binary | std::ofstream::in);
    if (ifs && !ifs.bad()) {
        std::stringstream body;
        body << ifs.rdbuf();
        ifs.close();

        std::string error;
        gJson = json11::Json::parse(body.str(), error);
    }

    gExtension->DialogBoxLFM((intptr_t)config_dialog, strlen(config_dialog), DlgProc);
}